

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::get_image_dimensions_query_size
               (Impl *impl,Builder *builder,Id image_id,uint32_t *num_coords)

{
  undefined8 uVar1;
  bool bVar2;
  Id typeId;
  Dim DVar3;
  void *pvVar4;
  char local_1048 [8];
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  bool is_array;
  Dim dim;
  Id image_type_id;
  uint32_t *num_coords_local;
  Id image_id_local;
  Builder *builder_local;
  Impl *impl_local;
  
  typeId = Converter::Impl::get_type_id(impl,image_id);
  DVar3 = spv::Builder::getTypeDimensionality(builder,typeId);
  bVar2 = spv::Builder::isArrayedImageType(builder,typeId);
  switch(DVar3) {
  case Dim1D:
  case DimBuffer:
    *num_coords = 1;
    break;
  case Dim2D:
  case DimCube:
    *num_coords = 2;
    break;
  case Dim3D:
    *num_coords = 3;
    break;
  default:
    buffer._4088_8_ = get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Unexpected sample dimensionality.\n");
      fflush(_stderr);
    }
    else {
      snprintf(local_1048,0x1000,"Unexpected sample dimensionality.\n");
      uVar1 = buffer._4088_8_;
      pvVar4 = get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar4,2,local_1048);
    }
    return false;
  }
  if (bVar2) {
    *num_coords = *num_coords + 1;
  }
  return true;
}

Assistant:

bool get_image_dimensions_query_size(Converter::Impl &impl, spv::Builder &builder, spv::Id image_id,
                                     uint32_t *num_coords)
{
	spv::Id image_type_id = impl.get_type_id(image_id);
	spv::Dim dim = builder.getTypeDimensionality(image_type_id);
	bool is_array = builder.isArrayedImageType(image_type_id);

	switch (dim)
	{
	case spv::Dim1D:
	case spv::DimBuffer:
		*num_coords = 1;
		break;

	case spv::Dim2D:
	case spv::DimCube:
		*num_coords = 2;
		break;

	case spv::Dim3D:
		*num_coords = 3;
		break;

	default:
		LOGE("Unexpected sample dimensionality.\n");
		return false;
	}

	if (is_array)
		(*num_coords)++;

	return true;
}